

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChGlyphs.cpp
# Opt level: O1

void __thiscall chrono::ChGlyphs::Reserve(ChGlyphs *this,uint n_glyphs)

{
  eCh_GlyphType eVar1;
  size_type __new_size;
  size_type __new_size_00;
  
  __new_size_00 = (size_type)n_glyphs;
  std::vector<chrono::ChColor,_std::allocator<chrono::ChColor>_>::resize
            (&this->colors,__new_size_00);
  std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::resize
            (&this->points,__new_size_00);
  eVar1 = this->draw_mode;
  if (eVar1 == GLYPH_POINT) {
    __new_size_00 = 0;
    __new_size = 0;
  }
  else if (eVar1 == GLYPH_COORDSYS) {
    __new_size = 0;
  }
  else {
    __new_size = __new_size_00;
    if (eVar1 == GLYPH_VECTOR) {
      __new_size_00 = 0;
    }
  }
  std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::resize
            (&this->vectors,__new_size);
  std::vector<chrono::ChQuaternion<double>,_std::allocator<chrono::ChQuaternion<double>_>_>::resize
            (&this->rotations,__new_size_00);
  return;
}

Assistant:

void ChGlyphs::Reserve(unsigned int n_glyphs) {
    colors.resize(n_glyphs);
    points.resize(n_glyphs);

    switch (this->draw_mode) {
        case GLYPH_POINT:
            vectors.resize(0);
            rotations.resize(0);
            return;
        case GLYPH_VECTOR:
            vectors.resize(n_glyphs);
            rotations.resize(0);
            return;
        case GLYPH_COORDSYS:
            vectors.resize(0);
            rotations.resize(n_glyphs);
            return;
        default:
            vectors.resize(n_glyphs);
            rotations.resize(n_glyphs);
    }
}